

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintIndented(ExpressionGraphContext *ctx,InplaceStr name,ExprBase *node,char *format,...)

{
  char in_AL;
  bool bVar1;
  char *pcVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ModuleData *local_50;
  ModuleData *importModule;
  va_list args;
  char *format_local;
  ExprBase *node_local;
  ExpressionGraphContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionGraphContext *)name.begin;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e0 = in_R9;
  args[0].reg_save_area = format;
  PrintIndent(ctx);
  bVar1 = InplaceStr::empty((InplaceStr *)&ctx_local);
  if (!bVar1) {
    OutputContext::Print(ctx->output,(char *)ctx_local,(int)name_local.begin - (int)ctx_local);
    OutputContext::Print(ctx->output,": ");
  }
  if ((node->type != (TypeBase *)0x0) && (bVar1 = InplaceStr::empty(&node->type->name), !bVar1)) {
    OutputContext::Print
              (ctx->output,(node->type->name).begin,
               (int)(node->type->name).end - (int)(node->type->name).begin);
    OutputContext::Print(ctx->output," ");
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  importModule._4_4_ = 0x30;
  importModule._0_4_ = 0x28;
  OutputContext::Print(ctx->output,(char *)args[0].reg_save_area,(__va_list_tag *)&importModule);
  if ((node->source != (SynBase *)0x0) && ((node->source->isInternal & 1U) == 0)) {
    pcVar2 = GetParseTreeNodeName(node->source);
    Print(ctx," // %s [%d:%d]-[%d:%d]",pcVar2,(ulong)(node->source->begin->line + 1),
          (ulong)node->source->begin->column,(ulong)(node->source->end->line + 1),
          node->source->end->column + node->source->end->length);
    local_50 = ExpressionContext::GetSourceOwner(ctx->ctx,node->source->begin);
    if (local_50 != (ModuleData *)0x0) {
      Print(ctx," from \'%.*s\'",
            (ulong)(uint)((int)(local_50->name).end - (int)(local_50->name).begin),
            (local_50->name).begin);
    }
  }
  OutputContext::Print(ctx->output,"\n");
  return;
}

Assistant:

void PrintIndented(ExpressionGraphContext &ctx, InplaceStr name, ExprBase *node, const char *format, ...)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(node->type && !node->type->name.empty())
	{
		ctx.output.Print(node->type->name.begin, unsigned(node->type->name.end - node->type->name.begin));
		ctx.output.Print(" ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	if(node->source && !node->source->isInternal)
	{
		Print(ctx, " // %s [%d:%d]-[%d:%d]", GetParseTreeNodeName(node->source), node->source->begin->line + 1, node->source->begin->column, node->source->end->line + 1, node->source->end->column + node->source->end->length);

		if(ModuleData *importModule = ctx.ctx.GetSourceOwner(node->source->begin))
			Print(ctx, " from '%.*s'", FMT_ISTR(importModule->name));
	}

	ctx.output.Print("\n");
}